

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::unget(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        *this)

{
  pointer pcVar1;
  size_t sVar2;
  size_t *psVar3;
  
  this->next_unget = true;
  (this->position).chars_read_total = (this->position).chars_read_total - 1;
  sVar2 = (this->position).chars_read_current_line;
  if (sVar2 == 0) {
    sVar2 = (this->position).lines_read;
    if (sVar2 == 0) goto LAB_0018bb82;
    psVar3 = &(this->position).lines_read;
  }
  else {
    psVar3 = &(this->position).chars_read_current_line;
  }
  *psVar3 = sVar2 - 1;
LAB_0018bb82:
  if (this->current != -1) {
    pcVar1 = (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar1 == (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start) {
      __assert_fail("token_string.size() != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                    ,0xccc,
                    "void nlohmann::detail::lexer<nlohmann::basic_json<>>::unget() [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1 + -1;
  }
  return;
}

Assistant:

void unget() {
		next_unget = true;

		--position.chars_read_total;

		// in case we "unget" a newline, we have to also decrement the lines_read
		if (position.chars_read_current_line == 0) {
			if (position.lines_read > 0) {
				--position.lines_read;
			}
		} else {
			--position.chars_read_current_line;
		}

		if (JSON_LIKELY(current != std::char_traits<char>::eof())) {
			assert(token_string.size() != 0);
			token_string.pop_back();
		}
	}